

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grant_message_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::GrantMessageTest_test_to_string_Test::TestBody
          (GrantMessageTest_test_to_string_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  bidfx_public_api::price::pixie::GrantMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
            (local_18,"\"Grant(granted=true, reason=)\"","access_granted.ToString()",
             (char (*) [29])"Grant(granted=true, reason=)",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/grant_message_test.cpp"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      }
      local_38._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(GrantMessageTest, test_to_string)
{
    ASSERT_EQ("Grant(granted=true, reason=)", access_granted.ToString());
}